

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::StringEnumeration::setChars
          (StringEnumeration *this,char *s,int32_t length,UErrorCode *status)

{
  UBool UVar1;
  size_t sVar2;
  char16_t *us;
  UChar *buffer;
  UErrorCode *status_local;
  int32_t length_local;
  char *s_local;
  StringEnumeration *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 != '\0') && (s != (char *)0x0)) {
    status_local._4_4_ = length;
    if (length < 0) {
      sVar2 = strlen(s);
      status_local._4_4_ = (int32_t)sVar2;
    }
    us = UnicodeString::getBuffer(&this->unistr,status_local._4_4_ + 1);
    if (us != (char16_t *)0x0) {
      u_charsToUChars_63(s,us,status_local._4_4_);
      us[status_local._4_4_] = L'\0';
      UnicodeString::releaseBuffer(&this->unistr,status_local._4_4_);
      return &this->unistr;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UnicodeString *)0x0;
}

Assistant:

UnicodeString *
StringEnumeration::setChars(const char *s, int32_t length, UErrorCode &status) {
    if(U_SUCCESS(status) && s!=NULL) {
        if(length<0) {
            length=(int32_t)uprv_strlen(s);
        }

        UChar *buffer=unistr.getBuffer(length+1);
        if(buffer!=NULL) {
            u_charsToUChars(s, buffer, length);
            buffer[length]=0;
            unistr.releaseBuffer(length);
            return &unistr;
        } else {
            status=U_MEMORY_ALLOCATION_ERROR;
        }
    }

    return NULL;
}